

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_unix.cpp
# Opt level: O0

void __thiscall QDnsLookupRunnable::query(QDnsLookupRunnable *this,QDnsLookupReply *reply)

{
  QSpan<unsigned_char,_18446744073709551615UL> qbuffer_00;
  QSpan<unsigned_char,_18446744073709551615UL> query_00;
  uint16_t uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  size_type sVar9;
  ulong *puVar10;
  long lVar11;
  QDnsHostAddressRecordPrivate *pQVar12;
  QDnsDomainNameRecordPrivate *pQVar13;
  QDnsMailExchangeRecordPrivate *pQVar14;
  QDnsServiceRecordPrivate *pQVar15;
  QDnsTlsAssociationRecordPrivate *pQVar16;
  QDnsTextRecordPrivate *pQVar17;
  QDnsLookupReply *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar18;
  uchar length;
  qptrdiff txt;
  quint8 matchType;
  quint8 selector;
  quint8 usage;
  quint16 port;
  quint16 weight;
  quint16 priority;
  quint16 preference;
  quint32 addr;
  quint16 size;
  quint32 ttl;
  qint16 rrclass;
  quint16 type;
  int answerIndex;
  int answerCount;
  qptrdiff offset;
  HEADER *header;
  int queryLength;
  int error;
  QDnsTextRecord record_8;
  QDnsTlsAssociationRecord record_7;
  QDnsServiceRecord record_6;
  QDnsMailExchangeRecord record_5;
  QDnsDomainNameRecord record_4;
  QDnsDomainNameRecord record_3;
  QDnsDomainNameRecord record_2;
  QDnsHostAddressRecord record_1;
  QDnsHostAddressRecord record;
  QString name;
  anon_class_56_5_c3b57c2e expandHost;
  int status;
  uchar *response;
  int responseLength;
  QSpan<unsigned_char,_18446744073709551615UL> query;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_network_kernel_qdnslookup_unix_cpp:240:30)>
  guard;
  ReplyBuffer buffer;
  QueryBuffer qbuffer;
  remove_pointer_t<res_state> state;
  uint in_stack_fffffffffffff388;
  int in_stack_fffffffffffff38c;
  undefined4 in_stack_fffffffffffff390;
  uint in_stack_fffffffffffff394;
  QList<QByteArray> *in_stack_fffffffffffff398;
  QDnsLookupReply *in_stack_fffffffffffff3a0;
  uint in_stack_fffffffffffff3b0;
  undefined1 in_stack_fffffffffffff3b4;
  uchar in_stack_fffffffffffff3b5;
  uchar in_stack_fffffffffffff3b6;
  uchar in_stack_fffffffffffff3b7;
  QDnsLookupReply *in_stack_fffffffffffff3b8;
  ReplyBuffer *in_stack_fffffffffffff3c0;
  undefined4 in_stack_fffffffffffff3c8;
  undefined2 in_stack_fffffffffffff3cc;
  undefined2 in_stack_fffffffffffff3ce;
  uint in_stack_fffffffffffff3d0;
  undefined2 in_stack_fffffffffffff3d4;
  unsigned_short in_stack_fffffffffffff3d6;
  char *in_stack_fffffffffffff3d8;
  QueryBuffer *in_stack_fffffffffffff3e0;
  undefined2 in_stack_fffffffffffff3e8;
  undefined2 in_stack_fffffffffffff3ea;
  undefined4 in_stack_fffffffffffff3ec;
  undefined4 in_stack_fffffffffffff428;
  uint in_stack_fffffffffffff42c;
  res_state in_stack_fffffffffffff430;
  undefined7 in_stack_fffffffffffff438;
  undefined1 in_stack_fffffffffffff43f;
  uchar *in_stack_fffffffffffff440;
  qsizetype in_stack_fffffffffffff448;
  quint16 in_stack_fffffffffffff460;
  undefined7 in_stack_fffffffffffff470;
  undefined1 in_stack_fffffffffffff477;
  byte bVar19;
  qsizetype in_stack_fffffffffffff478;
  int local_b60;
  long local_b58;
  uint local_b44;
  undefined8 local_948;
  undefined8 local_940;
  undefined8 local_938;
  undefined1 local_900 [24];
  uchar **local_8e8;
  int *local_8e0;
  int *local_8d8;
  QDnsLookupReply **local_8d0;
  int local_8c4;
  uchar *local_8c0 [4];
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined8 local_888;
  int local_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined1 *local_868;
  QDnsLookupReply *local_860;
  undefined8 local_858;
  undefined8 local_850;
  QVLABaseBase local_848 [52];
  undefined1 local_360 [288];
  undefined1 local_240 [568];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_860 = in_RSI;
  memcpy(local_240,&DAT_003e83d0,0x238);
  iVar6 = __res_ninit(local_240);
  if (iVar6 < 0) {
    piVar8 = __errno_location();
    iVar6 = (int)((ulong)in_stack_fffffffffffff398 >> 0x20);
    qErrnoWarning(*piVar8,"QDnsLookup: Resolver initialization failed");
    QDnsLookupReply::makeResolverSystemError(in_stack_fffffffffffff3a0,iVar6);
    goto LAB_00361fb7;
  }
  local_858 = 0xaaaaaaaaaaaaaaaa;
  local_850 = 0xaaaaaaaaaaaaaaaa;
  local_868 = local_240;
  qScopeGuard<QDnsLookupRunnable::query(QDnsLookupReply*)::__0>
            ((anon_class_8_1_a8a4b3b1_for_m_func *)
             CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388));
  memset(local_360,0xaa,0x120);
  QByteArray::constData((QByteArray *)0x36092e);
  iVar6 = prepareQueryBuffer((res_state)
                             CONCAT44(in_stack_fffffffffffff3ec,
                                      CONCAT22(in_stack_fffffffffffff3ea,in_stack_fffffffffffff3e8))
                             ,in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                             CONCAT22(in_stack_fffffffffffff3d6,in_stack_fffffffffffff3d4));
  if (iVar6 < 0) {
    QDnsLookupReply::makeResolverSystemError
              (in_stack_fffffffffffff3a0,(int)((ulong)in_stack_fffffffffffff398 >> 0x20));
    local_b44 = in_stack_fffffffffffff394;
  }
  else {
    local_878 = 0xaaaaaaaaaaaaaaaa;
    uStack_870 = 0xaaaaaaaaaaaaaaaa;
    std::array<unsigned_char,_288UL>::data((array<unsigned_char,_288UL> *)0x3609ab);
    QSpan<unsigned_char,_18446744073709551615UL>::QSpanBase
              ((QSpan<unsigned_char,_18446744073709551615UL> *)
               CONCAT44(in_stack_fffffffffffff394,in_stack_fffffffffffff390),
               (uchar *)CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388),0x3609c3);
    memset(local_848,0xaa,0x4e8);
    QVarLengthArray<unsigned_char,_1232LL>::QVarLengthArray
              ((QVarLengthArray<unsigned_char,_1232LL> *)
               CONCAT44(in_stack_fffffffffffff394,in_stack_fffffffffffff390),
               CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388));
    local_87c = -1;
    if (*(char *)(in_RDI + 0x46) == '\0') {
      local_890 = local_878;
      local_888 = uStack_870;
      in_stack_fffffffffffff388 = (uint)*(ushort *)(in_RDI + 0x44);
      qbuffer_00.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_size =
           in_stack_fffffffffffff448;
      qbuffer_00.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_data =
           in_stack_fffffffffffff440;
      local_87c = sendStandardDns((QDnsLookupReply *)
                                  CONCAT17(in_stack_fffffffffffff43f,in_stack_fffffffffffff438),
                                  in_stack_fffffffffffff430,qbuffer_00,in_stack_fffffffffffff3c0,
                                  (QHostAddress *)in_stack_fffffffffffff3b8,
                                  in_stack_fffffffffffff460);
      local_b44 = in_stack_fffffffffffff394;
LAB_00360b0d:
      if (-1 < local_87c) {
        if (local_87c < 0xc) {
          QString::QString((QString *)0x360b4e);
          QDnsLookupReply::makeInvalidReplyError
                    (in_stack_fffffffffffff3b8,
                     (QString *)
                     CONCAT17(in_stack_fffffffffffff3b7,
                              CONCAT16(in_stack_fffffffffffff3b6,
                                       CONCAT15(in_stack_fffffffffffff3b5,
                                                CONCAT14(in_stack_fffffffffffff3b4,
                                                         in_stack_fffffffffffff3b0)))));
          QString::~QString((QString *)0x360b70);
        }
        else {
          puVar10 = (ulong *)QVLABase<unsigned_char>::data((QVLABase<unsigned_char> *)local_848);
          if ((*puVar10 >> 0x18 & 0xf) == 0) {
            local_b58 = 0xc;
            local_8c0[0] = QVLABase<unsigned_char>::data((QVLABase<unsigned_char> *)local_848);
            local_8c4 = -0x55555556;
            memset(local_900,0xaa,0x38);
            memset(local_900,0,0x18);
            QList<(anonymous_namespace)::QDnsCachedName>::QList
                      ((QList<(anonymous_namespace)::QDnsCachedName> *)0x360c4c);
            local_8e8 = local_8c0;
            local_8e0 = &local_87c;
            local_8d8 = &local_8c4;
            local_8d0 = &local_860;
            uVar1 = ntohs((uint16_t)(*puVar10 >> 0x20));
            if (uVar1 == 1) {
              QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                        ((anon_class_56_5_c3b57c2e *)
                         CONCAT26(in_stack_fffffffffffff3d6,
                                  CONCAT24(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0)),
                         CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
              QString::~QString((QString *)0x360cdf);
              if (-1 < local_8c4) {
                if ((long)local_87c < (long)local_8c4 + 0x10) {
                  *puVar10 = *puVar10 & 0xffff0000ffffffff | 0xffff00000000;
                }
                else {
                  local_b58 = (long)(local_8c4 + 4) + 0xc;
                }
                goto LAB_00360d62;
              }
            }
            else {
LAB_00360d62:
              uVar1 = ntohs((uint16_t)(*puVar10 >> 0x20));
              if (uVar1 < 2) {
                uVar1 = ntohs((uint16_t)(*puVar10 >> 0x30));
                local_b60 = 0;
                do {
                  if (local_87c <= local_b58 || (int)(uint)uVar1 <= local_b60) break;
                  local_948 = 0xaaaaaaaaaaaaaaaa;
                  local_940 = 0xaaaaaaaaaaaaaaaa;
                  local_938 = 0xaaaaaaaaaaaaaaaa;
                  QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                            ((anon_class_56_5_c3b57c2e *)
                             CONCAT26(in_stack_fffffffffffff3d6,
                                      CONCAT24(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0))
                             ,CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
                  if (local_8c4 < 0) {
                    local_b44 = 1;
                  }
                  else {
                    lVar11 = local_8c4 + local_b58;
                    if ((long)local_87c < lVar11 + 10) {
                      local_b44 = 1;
                      local_b58 = lVar11;
                    }
                    else {
                      uVar2 = qFromBigEndian<unsigned_short>
                                        ((void *)CONCAT44(local_b44,in_stack_fffffffffffff390));
                      uVar3 = qFromBigEndian<unsigned_short>
                                        ((void *)CONCAT44(local_b44,in_stack_fffffffffffff390));
                      uVar7 = qFromBigEndian<unsigned_int>
                                        ((void *)CONCAT44(local_b44,in_stack_fffffffffffff390));
                      uVar4 = qFromBigEndian<unsigned_short>
                                        ((void *)CONCAT44(local_b44,in_stack_fffffffffffff390));
                      local_b58 = lVar11 + 10;
                      if ((long)local_87c < (long)(local_b58 + (ulong)uVar4)) {
                        local_b44 = 1;
                      }
                      else if (uVar3 == 1) {
                        if (uVar2 == 1) {
                          if (uVar4 == 4) {
                            qFromBigEndian<unsigned_int>
                                      ((void *)CONCAT44(local_b44,in_stack_fffffffffffff390));
                            QDnsHostAddressRecord::QDnsHostAddressRecord
                                      ((QDnsHostAddressRecord *)
                                       CONCAT44(local_b44,in_stack_fffffffffffff390));
                            pQVar12 = QSharedDataPointer<QDnsHostAddressRecordPrivate>::operator->
                                                ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *
                                                 )CONCAT44(local_b44,in_stack_fffffffffffff390));
                            QString::operator=(&(pQVar12->super_QDnsRecordPrivate).name,
                                               (QString *)&local_948);
                            pQVar12 = QSharedDataPointer<QDnsHostAddressRecordPrivate>::operator->
                                                ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *
                                                 )CONCAT44(local_b44,in_stack_fffffffffffff390));
                            (pQVar12->super_QDnsRecordPrivate).timeToLive = uVar7;
                            QHostAddress::QHostAddress
                                      ((QHostAddress *)in_stack_fffffffffffff3a0,
                                       (quint32)((ulong)in_stack_fffffffffffff398 >> 0x20));
                            QSharedDataPointer<QDnsHostAddressRecordPrivate>::operator->
                                      ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *)
                                       CONCAT44(local_b44,in_stack_fffffffffffff390));
                            QHostAddress::operator=
                                      ((QHostAddress *)CONCAT44(local_b44,in_stack_fffffffffffff390)
                                       ,(QHostAddress *)
                                        CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388
                                                ));
                            QHostAddress::~QHostAddress((QHostAddress *)0x36110a);
                            QList<QDnsHostAddressRecord>::append
                                      ((QList<QDnsHostAddressRecord> *)
                                       CONCAT44(local_b44,in_stack_fffffffffffff390),
                                       (parameter_type)
                                       CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388)
                                      );
                            QDnsHostAddressRecord::~QDnsHostAddressRecord
                                      ((QDnsHostAddressRecord *)0x361130);
                            in_stack_fffffffffffff42c = uVar7;
                            goto LAB_00361f1f;
                          }
                          QDnsLookup::tr((char *)in_stack_fffffffffffff398,
                                         (char *)CONCAT44(local_b44,in_stack_fffffffffffff390),
                                         in_stack_fffffffffffff38c);
                          QDnsLookupReply::makeInvalidReplyError
                                    (in_stack_fffffffffffff3b8,
                                     (QString *)
                                     CONCAT17(in_stack_fffffffffffff3b7,
                                              CONCAT16(in_stack_fffffffffffff3b6,
                                                       CONCAT15(in_stack_fffffffffffff3b5,
                                                                CONCAT14(in_stack_fffffffffffff3b4,
                                                                         in_stack_fffffffffffff3b0))
                                                      )));
                          QString::~QString((QString *)0x36103a);
                          local_b44 = 1;
                        }
                        else if (uVar2 == 0x1c) {
                          if (uVar4 == 0x10) {
                            QDnsHostAddressRecord::QDnsHostAddressRecord
                                      ((QDnsHostAddressRecord *)
                                       CONCAT44(local_b44,in_stack_fffffffffffff390));
                            pQVar12 = QSharedDataPointer<QDnsHostAddressRecordPrivate>::operator->
                                                ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *
                                                 )CONCAT44(local_b44,in_stack_fffffffffffff390));
                            QString::operator=(&(pQVar12->super_QDnsRecordPrivate).name,
                                               (QString *)&local_948);
                            pQVar12 = QSharedDataPointer<QDnsHostAddressRecordPrivate>::operator->
                                                ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *
                                                 )CONCAT44(local_b44,in_stack_fffffffffffff390));
                            (pQVar12->super_QDnsRecordPrivate).timeToLive = uVar7;
                            QHostAddress::QHostAddress
                                      ((QHostAddress *)in_stack_fffffffffffff3a0,
                                       (quint8 *)in_stack_fffffffffffff398);
                            QSharedDataPointer<QDnsHostAddressRecordPrivate>::operator->
                                      ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *)
                                       CONCAT44(local_b44,in_stack_fffffffffffff390));
                            QHostAddress::operator=
                                      ((QHostAddress *)CONCAT44(local_b44,in_stack_fffffffffffff390)
                                       ,(QHostAddress *)
                                        CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388
                                                ));
                            QHostAddress::~QHostAddress((QHostAddress *)0x36125f);
                            QList<QDnsHostAddressRecord>::append
                                      ((QList<QDnsHostAddressRecord> *)
                                       CONCAT44(local_b44,in_stack_fffffffffffff390),
                                       (parameter_type)
                                       CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388)
                                      );
                            QDnsHostAddressRecord::~QDnsHostAddressRecord
                                      ((QDnsHostAddressRecord *)0x361285);
                            goto LAB_00361f1f;
                          }
                          QDnsLookup::tr((char *)in_stack_fffffffffffff398,
                                         (char *)CONCAT44(local_b44,in_stack_fffffffffffff390),
                                         in_stack_fffffffffffff38c);
                          QDnsLookupReply::makeInvalidReplyError
                                    (in_stack_fffffffffffff3b8,
                                     (QString *)
                                     CONCAT17(in_stack_fffffffffffff3b7,
                                              CONCAT16(in_stack_fffffffffffff3b6,
                                                       CONCAT15(in_stack_fffffffffffff3b5,
                                                                CONCAT14(in_stack_fffffffffffff3b4,
                                                                         in_stack_fffffffffffff3b0))
                                                      )));
                          QString::~QString((QString *)0x3611a2);
                          local_b44 = 1;
                        }
                        else {
                          if (uVar2 == 5) {
                            QDnsDomainNameRecord::QDnsDomainNameRecord
                                      ((QDnsDomainNameRecord *)
                                       CONCAT44(local_b44,in_stack_fffffffffffff390));
                            pQVar13 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                                ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                                 CONCAT44(local_b44,in_stack_fffffffffffff390));
                            QString::operator=(&(pQVar13->super_QDnsRecordPrivate).name,
                                               (QString *)&local_948);
                            pQVar13 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                                ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                                 CONCAT44(local_b44,in_stack_fffffffffffff390));
                            (pQVar13->super_QDnsRecordPrivate).timeToLive = uVar7;
                            QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                      ((anon_class_56_5_c3b57c2e *)
                                       CONCAT26(in_stack_fffffffffffff3d6,
                                                CONCAT24(in_stack_fffffffffffff3d4,
                                                         in_stack_fffffffffffff3d0)),
                                       CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428)
                                      );
                            QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                      ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                       CONCAT44(local_b44,in_stack_fffffffffffff390));
                            QString::operator=((QString *)
                                               CONCAT44(local_b44,in_stack_fffffffffffff390),
                                               (QString *)
                                               CONCAT44(in_stack_fffffffffffff38c,
                                                        in_stack_fffffffffffff388));
                            QString::~QString((QString *)0x361348);
                            bVar18 = -1 < local_8c4;
                            if (bVar18) {
                              QList<QDnsDomainNameRecord>::append
                                        ((QList<QDnsDomainNameRecord> *)
                                         CONCAT44(local_b44,in_stack_fffffffffffff390),
                                         (parameter_type)
                                         CONCAT44(in_stack_fffffffffffff38c,
                                                  in_stack_fffffffffffff388));
                            }
                            else {
                              QDnsLookup::tr((char *)in_stack_fffffffffffff398,
                                             (char *)CONCAT44(local_b44,in_stack_fffffffffffff390),
                                             in_stack_fffffffffffff38c);
                              QDnsLookupReply::makeInvalidReplyError
                                        (in_stack_fffffffffffff3b8,
                                         (QString *)
                                         CONCAT17(in_stack_fffffffffffff3b7,
                                                  CONCAT16(in_stack_fffffffffffff3b6,
                                                           CONCAT15(in_stack_fffffffffffff3b5,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffff3b4,
                                                  in_stack_fffffffffffff3b0)))));
                              QString::~QString((QString *)0x3613a1);
                            }
                            QDnsDomainNameRecord::~QDnsDomainNameRecord
                                      ((QDnsDomainNameRecord *)0x3613df);
joined_r0x00361ae6:
                            local_b44 = (uint)!bVar18;
joined_r0x00361f09:
                            if (local_b44 != 0) goto LAB_00361f53;
                          }
                          else {
                            if (uVar2 == 2) {
                              QDnsDomainNameRecord::QDnsDomainNameRecord
                                        ((QDnsDomainNameRecord *)
                                         CONCAT44(local_b44,in_stack_fffffffffffff390));
                              pQVar13 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                                  ((QSharedDataPointer<QDnsDomainNameRecordPrivate>
                                                    *)CONCAT44(local_b44,in_stack_fffffffffffff390))
                              ;
                              QString::operator=(&(pQVar13->super_QDnsRecordPrivate).name,
                                                 (QString *)&local_948);
                              pQVar13 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                                  ((QSharedDataPointer<QDnsDomainNameRecordPrivate>
                                                    *)CONCAT44(local_b44,in_stack_fffffffffffff390))
                              ;
                              (pQVar13->super_QDnsRecordPrivate).timeToLive = uVar7;
                              QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                        ((anon_class_56_5_c3b57c2e *)
                                         CONCAT26(in_stack_fffffffffffff3d6,
                                                  CONCAT24(in_stack_fffffffffffff3d4,
                                                           in_stack_fffffffffffff3d0)),
                                         CONCAT44(in_stack_fffffffffffff42c,
                                                  in_stack_fffffffffffff428));
                              QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                        ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                         CONCAT44(local_b44,in_stack_fffffffffffff390));
                              QString::operator=((QString *)
                                                 CONCAT44(local_b44,in_stack_fffffffffffff390),
                                                 (QString *)
                                                 CONCAT44(in_stack_fffffffffffff38c,
                                                          in_stack_fffffffffffff388));
                              QString::~QString((QString *)0x3614b3);
                              bVar18 = -1 < local_8c4;
                              if (bVar18) {
                                QList<QDnsDomainNameRecord>::append
                                          ((QList<QDnsDomainNameRecord> *)
                                           CONCAT44(local_b44,in_stack_fffffffffffff390),
                                           (parameter_type)
                                           CONCAT44(in_stack_fffffffffffff38c,
                                                    in_stack_fffffffffffff388));
                              }
                              else {
                                QDnsLookup::tr((char *)in_stack_fffffffffffff398,
                                               (char *)CONCAT44(local_b44,in_stack_fffffffffffff390)
                                               ,in_stack_fffffffffffff38c);
                                QDnsLookupReply::makeInvalidReplyError
                                          (in_stack_fffffffffffff3b8,
                                           (QString *)
                                           CONCAT17(in_stack_fffffffffffff3b7,
                                                    CONCAT16(in_stack_fffffffffffff3b6,
                                                             CONCAT15(in_stack_fffffffffffff3b5,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff3b4,
                                                  in_stack_fffffffffffff3b0)))));
                                QString::~QString((QString *)0x361506);
                              }
                              QDnsDomainNameRecord::~QDnsDomainNameRecord
                                        ((QDnsDomainNameRecord *)0x361544);
                              goto joined_r0x00361ae6;
                            }
                            if (uVar2 == 0xc) {
                              QDnsDomainNameRecord::QDnsDomainNameRecord
                                        ((QDnsDomainNameRecord *)
                                         CONCAT44(local_b44,in_stack_fffffffffffff390));
                              pQVar13 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                                  ((QSharedDataPointer<QDnsDomainNameRecordPrivate>
                                                    *)CONCAT44(local_b44,in_stack_fffffffffffff390))
                              ;
                              QString::operator=(&(pQVar13->super_QDnsRecordPrivate).name,
                                                 (QString *)&local_948);
                              pQVar13 = QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                                  ((QSharedDataPointer<QDnsDomainNameRecordPrivate>
                                                    *)CONCAT44(local_b44,in_stack_fffffffffffff390))
                              ;
                              (pQVar13->super_QDnsRecordPrivate).timeToLive = uVar7;
                              QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                        ((anon_class_56_5_c3b57c2e *)
                                         CONCAT26(in_stack_fffffffffffff3d6,
                                                  CONCAT24(in_stack_fffffffffffff3d4,
                                                           in_stack_fffffffffffff3d0)),
                                         CONCAT44(in_stack_fffffffffffff42c,
                                                  in_stack_fffffffffffff428));
                              QSharedDataPointer<QDnsDomainNameRecordPrivate>::operator->
                                        ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                         CONCAT44(local_b44,in_stack_fffffffffffff390));
                              QString::operator=((QString *)
                                                 CONCAT44(local_b44,in_stack_fffffffffffff390),
                                                 (QString *)
                                                 CONCAT44(in_stack_fffffffffffff38c,
                                                          in_stack_fffffffffffff388));
                              QString::~QString((QString *)0x361612);
                              bVar18 = -1 < local_8c4;
                              if (bVar18) {
                                QList<QDnsDomainNameRecord>::append
                                          ((QList<QDnsDomainNameRecord> *)
                                           CONCAT44(local_b44,in_stack_fffffffffffff390),
                                           (parameter_type)
                                           CONCAT44(in_stack_fffffffffffff38c,
                                                    in_stack_fffffffffffff388));
                              }
                              else {
                                QDnsLookup::tr((char *)in_stack_fffffffffffff398,
                                               (char *)CONCAT44(local_b44,in_stack_fffffffffffff390)
                                               ,in_stack_fffffffffffff38c);
                                QDnsLookupReply::makeInvalidReplyError
                                          (in_stack_fffffffffffff3b8,
                                           (QString *)
                                           CONCAT17(in_stack_fffffffffffff3b7,
                                                    CONCAT16(in_stack_fffffffffffff3b6,
                                                             CONCAT15(in_stack_fffffffffffff3b5,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff3b4,
                                                  in_stack_fffffffffffff3b0)))));
                                QString::~QString((QString *)0x361665);
                              }
                              QDnsDomainNameRecord::~QDnsDomainNameRecord
                                        ((QDnsDomainNameRecord *)0x3616a6);
                              goto joined_r0x00361ae6;
                            }
                            if (uVar2 == 0xf) {
                              uVar2 = qFromBigEndian<unsigned_short>
                                                ((void *)CONCAT44(local_b44,
                                                                  in_stack_fffffffffffff390));
                              QDnsMailExchangeRecord::QDnsMailExchangeRecord
                                        ((QDnsMailExchangeRecord *)
                                         CONCAT44(local_b44,in_stack_fffffffffffff390));
                              QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                        ((anon_class_56_5_c3b57c2e *)
                                         CONCAT26(in_stack_fffffffffffff3d6,
                                                  CONCAT24(in_stack_fffffffffffff3d4,
                                                           in_stack_fffffffffffff3d0)),
                                         CONCAT44(in_stack_fffffffffffff42c,
                                                  in_stack_fffffffffffff428));
                              QSharedDataPointer<QDnsMailExchangeRecordPrivate>::operator->
                                        ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                         CONCAT44(local_b44,in_stack_fffffffffffff390));
                              QString::operator=((QString *)
                                                 CONCAT44(local_b44,in_stack_fffffffffffff390),
                                                 (QString *)
                                                 CONCAT44(in_stack_fffffffffffff38c,
                                                          in_stack_fffffffffffff388));
                              QString::~QString((QString *)0x361755);
                              pQVar14 = QSharedDataPointer<QDnsMailExchangeRecordPrivate>::
                                        operator->((
                                                  QSharedDataPointer<QDnsMailExchangeRecordPrivate>
                                                  *)CONCAT44(local_b44,in_stack_fffffffffffff390));
                              QString::operator=(&(pQVar14->super_QDnsRecordPrivate).name,
                                                 (QString *)&local_948);
                              pQVar14 = QSharedDataPointer<QDnsMailExchangeRecordPrivate>::
                                        operator->((
                                                  QSharedDataPointer<QDnsMailExchangeRecordPrivate>
                                                  *)CONCAT44(local_b44,in_stack_fffffffffffff390));
                              pQVar14->preference = uVar2;
                              pQVar14 = QSharedDataPointer<QDnsMailExchangeRecordPrivate>::
                                        operator->((
                                                  QSharedDataPointer<QDnsMailExchangeRecordPrivate>
                                                  *)CONCAT44(local_b44,in_stack_fffffffffffff390));
                              (pQVar14->super_QDnsRecordPrivate).timeToLive = uVar7;
                              bVar18 = -1 < local_8c4;
                              if (bVar18) {
                                QList<QDnsMailExchangeRecord>::append
                                          ((QList<QDnsMailExchangeRecord> *)
                                           CONCAT44(local_b44,in_stack_fffffffffffff390),
                                           (parameter_type)
                                           CONCAT44(in_stack_fffffffffffff38c,
                                                    in_stack_fffffffffffff388));
                              }
                              else {
                                QDnsLookup::tr((char *)in_stack_fffffffffffff398,
                                               (char *)CONCAT44(local_b44,in_stack_fffffffffffff390)
                                               ,in_stack_fffffffffffff38c);
                                QDnsLookupReply::makeInvalidReplyError
                                          (in_stack_fffffffffffff3b8,
                                           (QString *)
                                           CONCAT17(in_stack_fffffffffffff3b7,
                                                    CONCAT16(in_stack_fffffffffffff3b6,
                                                             CONCAT15(in_stack_fffffffffffff3b5,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff3b4,
                                                  in_stack_fffffffffffff3b0)))));
                                QString::~QString((QString *)0x36180b);
                              }
                              QDnsMailExchangeRecord::~QDnsMailExchangeRecord
                                        ((QDnsMailExchangeRecord *)0x361849);
                              goto joined_r0x00361ae6;
                            }
                            if (uVar2 == 0x21) {
                              if (uVar4 < 7) {
                                QDnsLookup::tr((char *)in_stack_fffffffffffff398,
                                               (char *)CONCAT44(local_b44,in_stack_fffffffffffff390)
                                               ,in_stack_fffffffffffff38c);
                                QDnsLookupReply::makeInvalidReplyError
                                          (in_stack_fffffffffffff3b8,
                                           (QString *)
                                           CONCAT17(in_stack_fffffffffffff3b7,
                                                    CONCAT16(in_stack_fffffffffffff3b6,
                                                             CONCAT15(in_stack_fffffffffffff3b5,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff3b4,
                                                  in_stack_fffffffffffff3b0)))));
                                QString::~QString((QString *)0x3618c6);
                                local_b44 = 1;
                                goto LAB_00361f53;
                              }
                              uVar2 = qFromBigEndian<unsigned_short>
                                                ((void *)CONCAT44(local_b44,
                                                                  in_stack_fffffffffffff390));
                              uVar3 = qFromBigEndian<unsigned_short>
                                                ((void *)CONCAT44(local_b44,
                                                                  in_stack_fffffffffffff390));
                              uVar5 = qFromBigEndian<unsigned_short>
                                                ((void *)CONCAT44(local_b44,
                                                                  in_stack_fffffffffffff390));
                              QDnsServiceRecord::QDnsServiceRecord
                                        ((QDnsServiceRecord *)
                                         CONCAT44(local_b44,in_stack_fffffffffffff390));
                              pQVar15 = QSharedDataPointer<QDnsServiceRecordPrivate>::operator->
                                                  ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                                   CONCAT44(local_b44,in_stack_fffffffffffff390));
                              QString::operator=(&(pQVar15->super_QDnsRecordPrivate).name,
                                                 (QString *)&local_948);
                              QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                        ((anon_class_56_5_c3b57c2e *)
                                         CONCAT26(in_stack_fffffffffffff3d6,
                                                  CONCAT24(in_stack_fffffffffffff3d4,
                                                           in_stack_fffffffffffff3d0)),
                                         CONCAT44(in_stack_fffffffffffff42c,
                                                  in_stack_fffffffffffff428));
                              QSharedDataPointer<QDnsServiceRecordPrivate>::operator->
                                        ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                         CONCAT44(local_b44,in_stack_fffffffffffff390));
                              QString::operator=((QString *)
                                                 CONCAT44(local_b44,in_stack_fffffffffffff390),
                                                 (QString *)
                                                 CONCAT44(in_stack_fffffffffffff38c,
                                                          in_stack_fffffffffffff388));
                              QString::~QString((QString *)0x3619c1);
                              pQVar15 = QSharedDataPointer<QDnsServiceRecordPrivate>::operator->
                                                  ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                                   CONCAT44(local_b44,in_stack_fffffffffffff390));
                              pQVar15->port = uVar5;
                              pQVar15 = QSharedDataPointer<QDnsServiceRecordPrivate>::operator->
                                                  ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                                   CONCAT44(local_b44,in_stack_fffffffffffff390));
                              pQVar15->priority = uVar2;
                              pQVar15 = QSharedDataPointer<QDnsServiceRecordPrivate>::operator->
                                                  ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                                   CONCAT44(local_b44,in_stack_fffffffffffff390));
                              (pQVar15->super_QDnsRecordPrivate).timeToLive = uVar7;
                              pQVar15 = QSharedDataPointer<QDnsServiceRecordPrivate>::operator->
                                                  ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                                   CONCAT44(local_b44,in_stack_fffffffffffff390));
                              pQVar15->weight = uVar3;
                              bVar18 = -1 < local_8c4;
                              if (bVar18) {
                                QList<QDnsServiceRecord>::append
                                          ((QList<QDnsServiceRecord> *)
                                           CONCAT44(local_b44,in_stack_fffffffffffff390),
                                           (parameter_type)
                                           CONCAT44(in_stack_fffffffffffff38c,
                                                    in_stack_fffffffffffff388));
                              }
                              else {
                                QDnsLookup::tr((char *)in_stack_fffffffffffff398,
                                               (char *)CONCAT44(local_b44,in_stack_fffffffffffff390)
                                               ,in_stack_fffffffffffff38c);
                                QDnsLookupReply::makeInvalidReplyError
                                          (in_stack_fffffffffffff3b8,
                                           (QString *)
                                           CONCAT17(in_stack_fffffffffffff3b7,
                                                    CONCAT16(in_stack_fffffffffffff3b6,
                                                             CONCAT15(in_stack_fffffffffffff3b5,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff3b4,
                                                  in_stack_fffffffffffff3b0)))));
                                QString::~QString((QString *)0x361a9c);
                              }
                              QDnsServiceRecord::~QDnsServiceRecord((QDnsServiceRecord *)0x361add);
                              in_stack_fffffffffffff3d0 = uVar7;
                              in_stack_fffffffffffff3d6 = uVar3;
                              goto joined_r0x00361ae6;
                            }
                            if (uVar2 != 0x34) {
                              if (uVar2 != 0x10) goto LAB_00361f1f;
                              QDnsTextRecord::QDnsTextRecord
                                        ((QDnsTextRecord *)
                                         CONCAT44(local_b44,in_stack_fffffffffffff390));
                              pQVar17 = QSharedDataPointer<QDnsTextRecordPrivate>::operator->
                                                  ((QSharedDataPointer<QDnsTextRecordPrivate> *)
                                                   CONCAT44(local_b44,in_stack_fffffffffffff390));
                              QString::operator=(&(pQVar17->super_QDnsRecordPrivate).name,
                                                 (QString *)&local_948);
                              pQVar17 = QSharedDataPointer<QDnsTextRecordPrivate>::operator->
                                                  ((QSharedDataPointer<QDnsTextRecordPrivate> *)
                                                   CONCAT44(local_b44,in_stack_fffffffffffff390));
                              (pQVar17->super_QDnsRecordPrivate).timeToLive = uVar7;
                              for (lVar11 = local_b58; lVar11 < (long)(local_b58 + (ulong)uVar4);
                                  lVar11 = (ulong)bVar19 + lVar11) {
                                bVar19 = local_8c0[0][lVar11];
                                lVar11 = lVar11 + 1;
                                if ((long)(local_b58 + (ulong)uVar4) <
                                    (long)(lVar11 + (ulong)bVar19)) {
                                  in_stack_fffffffffffff3a0 = local_860;
                                  QDnsLookup::tr((char *)in_stack_fffffffffffff398,
                                                 (char *)CONCAT44(local_b44,
                                                                  in_stack_fffffffffffff390),
                                                 in_stack_fffffffffffff38c);
                                  QDnsLookupReply::makeInvalidReplyError
                                            (in_stack_fffffffffffff3b8,
                                             (QString *)
                                             CONCAT17(in_stack_fffffffffffff3b7,
                                                      CONCAT16(in_stack_fffffffffffff3b6,
                                                               CONCAT15(in_stack_fffffffffffff3b5,
                                                                        CONCAT14(
                                                  in_stack_fffffffffffff3b4,
                                                  in_stack_fffffffffffff3b0)))));
                                  QString::~QString((QString *)0x361e2e);
                                  local_b44 = 1;
                                  goto LAB_00361ef3;
                                }
                                pQVar17 = QSharedDataPointer<QDnsTextRecordPrivate>::operator->
                                                    ((QSharedDataPointer<QDnsTextRecordPrivate> *)
                                                     CONCAT44(local_b44,in_stack_fffffffffffff390));
                                in_stack_fffffffffffff398 = &pQVar17->values;
                                QByteArrayView::QByteArrayView<unsigned_char,_true>
                                          ((QByteArrayView *)in_stack_fffffffffffff3a0,
                                           (uchar *)in_stack_fffffffffffff398,
                                           CONCAT44(local_b44,in_stack_fffffffffffff390));
                                QByteArrayView::toByteArray
                                          ((QByteArrayView *)
                                           CONCAT44(local_b44,in_stack_fffffffffffff390));
                                QList<QByteArray>::operator<<
                                          ((QList<QByteArray> *)
                                           CONCAT44(local_b44,in_stack_fffffffffffff390),
                                           (rvalue_ref)
                                           CONCAT44(in_stack_fffffffffffff38c,
                                                    in_stack_fffffffffffff388));
                                QByteArray::~QByteArray((QByteArray *)0x361eaf);
                              }
                              QList<QDnsTextRecord>::append
                                        ((QList<QDnsTextRecord> *)
                                         CONCAT44(local_b44,in_stack_fffffffffffff390),
                                         (parameter_type)
                                         CONCAT44(in_stack_fffffffffffff38c,
                                                  in_stack_fffffffffffff388));
                              local_b44 = 0;
LAB_00361ef3:
                              QDnsTextRecord::~QDnsTextRecord((QDnsTextRecord *)0x361f00);
                              goto joined_r0x00361f09;
                            }
                            if (uVar4 < 3) {
                              in_stack_fffffffffffff3b8 = local_860;
                              QDnsLookup::tr((char *)in_stack_fffffffffffff398,
                                             (char *)CONCAT44(local_b44,in_stack_fffffffffffff390),
                                             in_stack_fffffffffffff38c);
                              QDnsLookupReply::makeInvalidReplyError
                                        (in_stack_fffffffffffff3b8,
                                         (QString *)
                                         CONCAT17(in_stack_fffffffffffff3b7,
                                                  CONCAT16(in_stack_fffffffffffff3b6,
                                                           CONCAT15(in_stack_fffffffffffff3b5,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffff3b4,
                                                  in_stack_fffffffffffff3b0)))));
                              QString::~QString((QString *)0x361b5a);
                              local_b44 = 1;
                              goto LAB_00361f53;
                            }
                            in_stack_fffffffffffff3b5 = local_8c0[0][local_b58];
                            in_stack_fffffffffffff3b6 = local_8c0[0][lVar11 + 0xb];
                            in_stack_fffffffffffff3b7 = local_8c0[0][lVar11 + 0xc];
                            QDnsTlsAssociationRecord::QDnsTlsAssociationRecord
                                      ((QDnsTlsAssociationRecord *)
                                       CONCAT44(local_b44,in_stack_fffffffffffff390));
                            pQVar16 = QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                      ::operator->((
                                                  QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                                  *)0x361be3);
                            QString::operator=(&(pQVar16->super_QDnsRecordPrivate).name,
                                               (QString *)&local_948);
                            pQVar16 = QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                      ::operator->((
                                                  QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                                  *)0x361c0f);
                            (pQVar16->super_QDnsRecordPrivate).timeToLive = uVar7;
                            pQVar16 = QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                      ::operator->((
                                                  QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                                  *)0x361c2e);
                            (pQVar16->super_QDnsRecordPrivate).field_0x24 =
                                 in_stack_fffffffffffff3b5;
                            pQVar16 = QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                      ::operator->((
                                                  QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                                  *)0x361c4d);
                            (pQVar16->super_QDnsRecordPrivate).field_0x25 =
                                 in_stack_fffffffffffff3b6;
                            pQVar16 = QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                      ::operator->((
                                                  QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                                  *)0x361c6c);
                            (pQVar16->super_QDnsRecordPrivate).field_0x26 =
                                 in_stack_fffffffffffff3b7;
                            QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>::
                            operator->((QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                        *)0x361c80);
                            QByteArray::assign<unsigned_char_*,_true>
                                      ((QByteArray *)in_stack_fffffffffffff3a0,
                                       (uchar *)in_stack_fffffffffffff398,
                                       (uchar *)CONCAT44(local_b44,in_stack_fffffffffffff390));
                            QList<QDnsTlsAssociationRecord>::append
                                      ((QList<QDnsTlsAssociationRecord> *)
                                       CONCAT44(local_b44,in_stack_fffffffffffff390),
                                       (rvalue_ref)
                                       CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388)
                                      );
                            QDnsTlsAssociationRecord::~QDnsTlsAssociationRecord
                                      ((QDnsTlsAssociationRecord *)0x361ce6);
                            in_stack_fffffffffffff3b0 = uVar7;
                          }
LAB_00361f1f:
                          local_b58 = (ulong)uVar4 + local_b58;
                          local_b60 = local_b60 + 1;
                          local_b44 = 0;
                        }
                      }
                      else {
                        local_b44 = 3;
                      }
                    }
                  }
LAB_00361f53:
                  QString::~QString((QString *)0x361f60);
                } while ((local_b44 == 0) || (local_b44 == 3));
              }
              else {
                QString::QString((QString *)0x360da4);
                QDnsLookupReply::makeInvalidReplyError
                          (in_stack_fffffffffffff3b8,
                           (QString *)
                           CONCAT17(in_stack_fffffffffffff3b7,
                                    CONCAT16(in_stack_fffffffffffff3b6,
                                             CONCAT15(in_stack_fffffffffffff3b5,
                                                      CONCAT14(in_stack_fffffffffffff3b4,
                                                               in_stack_fffffffffffff3b0)))));
                QString::~QString((QString *)0x360dc6);
              }
            }
            query(QDnsLookupReply*)::$_1::~__1((anon_class_56_5_c3b57c2e *)0x361f9d);
          }
          else {
            QDnsLookupReply::makeDnsRcodeError
                      (in_stack_fffffffffffff3a0,(quint8)((ulong)in_stack_fffffffffffff398 >> 0x38))
            ;
          }
        }
      }
    }
    else {
      local_b44 = in_stack_fffffffffffff394;
      if (*(char *)(in_RDI + 0x46) != '\x01') goto LAB_00360b0d;
      local_8a0 = local_878;
      local_898 = uStack_870;
      query_00.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_data._7_1_ =
           in_stack_fffffffffffff477;
      query_00.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_data._0_7_ =
           in_stack_fffffffffffff470;
      query_00.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_size =
           in_stack_fffffffffffff478;
      bVar18 = sendDnsOverTls((QDnsLookupRunnable *)
                              CONCAT26(in_stack_fffffffffffff3d6,
                                       CONCAT24(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0)
                                      ),
                              (QDnsLookupReply *)
                              CONCAT26(in_stack_fffffffffffff3ce,
                                       CONCAT24(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8)
                                      ),query_00,in_stack_fffffffffffff3c0);
      local_b44 = in_stack_fffffffffffff394;
      if (bVar18) {
        sVar9 = QVLABaseBase::size(local_848);
        local_87c = (int)sVar9;
        local_b44 = in_stack_fffffffffffff394;
        goto LAB_00360b0d;
      }
    }
    QVarLengthArray<unsigned_char,_1232LL>::~QVarLengthArray
              ((QVarLengthArray<unsigned_char,_1232LL> *)
               CONCAT44(local_b44,in_stack_fffffffffffff390));
  }
  QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/kernel/qdnslookup_unix.cpp:240:30)>
  ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_network_kernel_qdnslookup_unix_cpp:240:30)>
                  *)CONCAT44(local_b44,in_stack_fffffffffffff390));
LAB_00361fb7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDnsLookupRunnable::query(QDnsLookupReply *reply)
{
    // Initialize state.
    std::remove_pointer_t<res_state> state = {};
    if (res_ninit(&state) < 0) {
        int error = errno;
        qErrnoWarning(error, "QDnsLookup: Resolver initialization failed");
        return reply->makeResolverSystemError(error);
    }
    auto guard = qScopeGuard([&] { res_nclose(&state); });

#ifdef QDNSLOOKUP_DEBUG
    state.options |= RES_DEBUG;
#endif

    // Prepare the DNS query.
    QueryBuffer qbuffer;
    int queryLength = prepareQueryBuffer(&state, qbuffer, requestName.constData(), ns_rcode(requestType));
    if (Q_UNLIKELY(queryLength < 0))
        return reply->makeResolverSystemError();

    // Perform DNS query.
    QSpan query(qbuffer.data(), queryLength);
    ReplyBuffer buffer(ReplyBufferSize);
    int responseLength = -1;
    switch (protocol) {
    case QDnsLookup::Standard:
        responseLength = sendStandardDns(reply, &state, query, buffer, nameserver, port);
        break;
    case QDnsLookup::DnsOverTls:
        if (!sendDnsOverTls(reply, query, buffer))
            return;
        responseLength = buffer.size();
        break;
    }

    if (responseLength < 0)
        return;

    // Check the reply is valid.
    if (responseLength < int(sizeof(HEADER)))
        return reply->makeInvalidReplyError();

    // Parse the reply.
    auto header = reinterpret_cast<HEADER *>(buffer.data());
    if (header->rcode)
        return reply->makeDnsRcodeError(header->rcode);

    qptrdiff offset = sizeof(HEADER);
    unsigned char *response = buffer.data();
    int status;

    auto expandHost = [&, cache = Cache{}](qptrdiff offset) mutable {
        if (uchar n = response[offset]; n & NS_CMPRSFLGS) {
            // compressed name, see if we already have it cached
            if (offset + 1 < responseLength) {
                int id = ((n & ~NS_CMPRSFLGS) << 8) | response[offset + 1];
                auto it = std::find_if(cache.constBegin(), cache.constEnd(),
                                  [id](const QDnsCachedName &n) { return n.code == id; });
                if (it != cache.constEnd()) {
                    status = 2;
                    return it->name;
                }
            }
        }

        // uncached, expand it
        char host[MAXCDNAME + 1];
        status = dn_expand(response, response + responseLength, response + offset,
                           host, sizeof(host));
        if (status >= 0)
            return cache.emplaceBack(decodeLabel(QLatin1StringView(host)), offset).name;

        // failed
        reply->makeInvalidReplyError(QDnsLookup::tr("Could not expand domain name"));
        return QString();
    };

    if (ntohs(header->qdcount) == 1) {
        // Skip the query host, type (2 bytes) and class (2 bytes).
        expandHost(offset);
        if (status < 0)
            return;
        if (offset + status + 4 > responseLength)
            header->qdcount = 0xffff;   // invalid reply below
        else
            offset += status + 4;
    }
    if (ntohs(header->qdcount) > 1)
        return reply->makeInvalidReplyError();

    // Extract results.
    const int answerCount = ntohs(header->ancount);
    int answerIndex = 0;
    while ((offset < responseLength) && (answerIndex < answerCount)) {
        const QString name = expandHost(offset);
        if (status < 0)
            return;

        offset += status;
        if (offset + RRFIXEDSZ > responseLength) {
            // probably just a truncated reply, return what we have
            return;
        }
        const quint16 type = qFromBigEndian<quint16>(response + offset);
        const qint16 rrclass = qFromBigEndian<quint16>(response + offset + 2);
        const quint32 ttl = qFromBigEndian<quint32>(response + offset + 4);
        const quint16 size = qFromBigEndian<quint16>(response + offset + 8);
        offset += RRFIXEDSZ;
        if (offset + size > responseLength)
            return;             // truncated
        if (rrclass != C_IN)
            continue;

        if (type == QDnsLookup::A) {
            if (size != 4)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid IPv4 address record"));
            const quint32 addr = qFromBigEndian<quint32>(response + offset);
            QDnsHostAddressRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = QHostAddress(addr);
            reply->hostAddressRecords.append(record);
        } else if (type == QDnsLookup::AAAA) {
            if (size != 16)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid IPv6 address record"));
            QDnsHostAddressRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = QHostAddress(response + offset);
            reply->hostAddressRecords.append(record);
        } else if (type == QDnsLookup::CNAME) {
            QDnsDomainNameRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = expandHost(offset);
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid canonical name record"));
            reply->canonicalNameRecords.append(record);
        } else if (type == QDnsLookup::NS) {
            QDnsDomainNameRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = expandHost(offset);
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid name server record"));
            reply->nameServerRecords.append(record);
        } else if (type == QDnsLookup::PTR) {
            QDnsDomainNameRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = expandHost(offset);
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid pointer record"));
            reply->pointerRecords.append(record);
        } else if (type == QDnsLookup::MX) {
            const quint16 preference = qFromBigEndian<quint16>(response + offset);
            QDnsMailExchangeRecord record;
            record.d->exchange = expandHost(offset + 2);
            record.d->name = name;
            record.d->preference = preference;
            record.d->timeToLive = ttl;
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid mail exchange record"));
            reply->mailExchangeRecords.append(record);
        } else if (type == QDnsLookup::SRV) {
            if (size < 7)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid service record"));
            const quint16 priority = qFromBigEndian<quint16>(response + offset);
            const quint16 weight = qFromBigEndian<quint16>(response + offset + 2);
            const quint16 port = qFromBigEndian<quint16>(response + offset + 4);
            QDnsServiceRecord record;
            record.d->name = name;
            record.d->target = expandHost(offset + 6);
            record.d->port = port;
            record.d->priority = priority;
            record.d->timeToLive = ttl;
            record.d->weight = weight;
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid service record"));
            reply->serviceRecords.append(record);
        } else if (type == QDnsLookup::TLSA) {
            // https://datatracker.ietf.org/doc/html/rfc6698#section-2.1
            if (size < 3)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid TLS association record"));

            const quint8 usage = response[offset];
            const quint8 selector = response[offset + 1];
            const quint8 matchType = response[offset + 2];

            QDnsTlsAssociationRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->usage = QDnsTlsAssociationRecord::CertificateUsage(usage);
            record.d->selector = QDnsTlsAssociationRecord::Selector(selector);
            record.d->matchType = QDnsTlsAssociationRecord::MatchingType(matchType);
            record.d->value.assign(response + offset + 3, response + offset + size);
            reply->tlsAssociationRecords.append(std::move(record));
        } else if (type == QDnsLookup::TXT) {
            QDnsTextRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            qptrdiff txt = offset;
            while (txt < offset + size) {
                const unsigned char length = response[txt];
                txt++;
                if (txt + length > offset + size)
                    return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid text record"));
                record.d->values << QByteArrayView(response + txt, length).toByteArray();
                txt += length;
            }
            reply->textRecords.append(record);
        }
        offset += size;
        answerIndex++;
    }
}